

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O0

lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_handle_for<int,std::shared_timed_mutex,std::chrono::duration<long,std::ratio<1l,1000l>>>
          (lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this,
          int *obj,shared_timed_mutex *gmutex,duration<long,_std::ratio<1L,_1000L>_> *d)

{
  bool bVar1;
  unique_lock<std::shared_timed_mutex> local_68;
  undefined4 local_58;
  unique_lock<std::shared_timed_mutex> local_48;
  undefined1 local_38 [8];
  lock_type glock;
  duration<long,_std::ratio<1L,_1000L>_> *d_local;
  shared_timed_mutex *gmutex_local;
  int *obj_local;
  
  glock._8_8_ = gmutex;
  std::unique_lock<std::shared_timed_mutex>::unique_lock<long,std::ratio<1l,1000l>>
            ((unique_lock<std::shared_timed_mutex> *)local_38,(mutex_type *)obj,
             (duration<long,_std::ratio<1L,_1000L>_> *)gmutex);
  bVar1 = std::unique_lock<std::shared_timed_mutex>::owns_lock
                    ((unique_lock<std::shared_timed_mutex> *)local_38);
  if (bVar1) {
    std::unique_lock<std::shared_timed_mutex>::unique_lock
              (&local_48,(unique_lock<std::shared_timed_mutex> *)local_38);
    lock_handle<int,_std::shared_timed_mutex>::lock_handle
              (__return_storage_ptr__,(pointer)this,&local_48);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_48);
  }
  else {
    std::unique_lock<std::shared_timed_mutex>::unique_lock
              (&local_68,(unique_lock<std::shared_timed_mutex> *)local_38);
    lock_handle<int,_std::shared_timed_mutex>::lock_handle
              (__return_storage_ptr__,(pointer)0x0,&local_68);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_68);
  }
  local_58 = 1;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

lock_handle<T, M> try_lock_handle_for(T* obj, M& gmutex, const Duration& d)
{
    typename lock_handle<T, M>::lock_type glock(gmutex, d);
    if (glock.owns_lock()) {
        return lock_handle<T, M>(obj, std::move(glock));
    } else {
        return lock_handle<T, M>(nullptr, std::move(glock));
    }
}